

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
llvm::SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>::push_back
          (SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false> *this,Entry *Elt)

{
  uint64_t *puVar1;
  uint64_t uVar2;
  uint uVar3;
  
  uVar3 = (this->super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>).
          super_SmallVectorBase.Size;
  if ((this->super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>).
      super_SmallVectorBase.Capacity <= uVar3) {
    grow(this,0);
    uVar3 = (this->super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>).
            super_SmallVectorBase.Size;
  }
  uVar2 = Elt->End;
  puVar1 = (uint64_t *)
           ((long)(this->super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>).
                  super_SmallVectorBase.BeginX + (ulong)uVar3 * 0x28);
  *puVar1 = Elt->Begin;
  puVar1[1] = uVar2;
  SmallVector<unsigned_char,_4U>::SmallVector
            ((SmallVector<unsigned_char,_4U> *)(puVar1 + 2),&Elt->Loc);
  uVar3 = (this->super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>).
          super_SmallVectorBase.Size;
  if (uVar3 < (this->super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>).
              super_SmallVectorBase.Capacity) {
    (this->super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>).super_SmallVectorBase.
    Size = uVar3 + 1;
    return;
  }
  __assert_fail("N <= capacity()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                ,0x43,"void llvm::SmallVectorBase::set_size(size_t)");
}

Assistant:

void push_back(T &&Elt) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    ::new ((void*) this->end()) T(::std::move(Elt));
    this->set_size(this->size() + 1);
  }